

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_shuffle_8(c_v128 a,c_v128 pattern)

{
  int c;
  c_v128 pattern_local;
  c_v128 a_local;
  c_v128 t;
  
  a_local.u64[0] = a.u64[0];
  a_local.u64[1] = a.u64[1];
  pattern_local.u64[0] = pattern.u64[0];
  pattern_local.u64[1] = pattern.u64[1];
  for (c = 0; c < 0x10; c = c + 1) {
    t.u8[c] = a_local.u8[(int)(pattern_local.u8[c] & 0xf)];
  }
  return t;
}

Assistant:

SIMD_INLINE c_v128 c_v128_shuffle_8(c_v128 a, c_v128 pattern) {
  c_v128 t;
  int c;
  for (c = 0; c < 16; c++)
    t.u8[c] = a.u8[CONFIG_BIG_ENDIAN ? 15 - (pattern.u8[c] & 15)
                                     : pattern.u8[c] & 15];

  return t;
}